

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O0

int __thiscall dcs::FileHeader::readFrom(FileHeader *this,char *buf,size_t len)

{
  int iVar1;
  runtime_error *prVar2;
  char *pcVar3;
  uchar *puVar4;
  char (*in_RDX) [2];
  char (*in_RSI) [85];
  string *in_RDI;
  uint n_3;
  uint n_2;
  uint n_1;
  uint n;
  size_t nread;
  size_t *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  string local_148 [32];
  undefined4 local_128;
  allocator local_121;
  string local_120 [35];
  undefined1 local_fd;
  undefined4 local_fc;
  string local_f8 [32];
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [35];
  undefined1 local_ad;
  undefined4 local_ac;
  string local_a8 [32];
  undefined4 local_88;
  allocator local_81;
  string local_80 [35];
  undefined1 local_5d;
  undefined4 local_4c;
  string local_48 [36];
  undefined4 local_24;
  int *piVar5;
  char (*args_1) [85];
  string *args;
  
  piVar5 = (int *)0x0;
  local_24 = 0x20;
  if (in_RDX < (char (*) [2])0x20) {
    local_5d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_4c = 0x10;
    util::str<char[42],char[85],char[2],int>((char (*) [42])in_RDI,in_RSI,in_RDX,piVar5);
    std::runtime_error::runtime_error(prVar2,local_48);
    local_5d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  args_1 = in_RSI;
  args = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,*in_RSI,0x20,&local_81);
  std::__cxx11::string::operator=(in_RDI,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  piVar5 = piVar5 + 8;
  local_88 = 8;
  if ((ulong)((long)in_RDX - (long)piVar5) < 8) {
    local_ad = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_ac = 0x18;
    util::str<char[42],char[85],char[2],int>((char (*) [42])args,args_1,in_RDX,piVar5);
    std::runtime_error::runtime_error(prVar2,local_a8);
    local_ad = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = *args_1 + (long)piVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar3,8,&local_d1);
  iVar1 = std::__cxx11::stoi(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
  *(int *)(in_RDI + 0x20) = iVar1;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  piVar5 = piVar5 + 2;
  local_d8 = 0x14;
  if ((ulong)((long)in_RDX - (long)piVar5) < 0x14) {
    local_fd = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_fc = 0x20;
    util::str<char[42],char[85],char[2],int>((char (*) [42])args,args_1,in_RDX,piVar5);
    std::runtime_error::runtime_error(prVar2,local_f8);
    local_fd = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = *args_1 + (long)piVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,pcVar3,0x14,&local_121);
  std::__cxx11::string::operator=(in_RDI + 0x28,local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  piVar5 = piVar5 + 5;
  local_128 = 8;
  if ((ulong)((long)in_RDX - (long)piVar5) < 8) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[42],char[85],char[2],int>((char (*) [42])args,args_1,in_RDX,piVar5);
    std::runtime_error::runtime_error(prVar2,local_148);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1225a5);
  *(undefined8 *)puVar4 = *(undefined8 *)(*args_1 + (long)piVar5);
  return (int)piVar5 + 8;
}

Assistant:

int FileHeader::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 32 bytes hold the DCS file name (and trailing spaces)
  {
    constexpr unsigned n = 32;
    ASSERT((len - nread) >= n);
    name = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding length of payload
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    length = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 20 bytes holding some ASCII data
  {
    constexpr unsigned n = 20;
    ASSERT((len - nread) >= n);
    misc1 = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding some binary data
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    misc2.resize(n);
    memcpy(misc2.data(), &buf[nread], n);
    nread += n;
  }

  return nread;
}